

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O2

bool __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::Add(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
      *this,JavascriptPromise *key,int data)

{
  uint targetBucket;
  EntryType *pEVar1;
  
  targetBucket = HashKeyToBucket(this,key);
  pEVar1 = FindEntry(this,key,targetBucket);
  if (pEVar1 == (EntryType *)0x0) {
    AddInternal(this,key,data,targetBucket);
  }
  return pEVar1 == (EntryType *)0x0;
}

Assistant:

bool Add(TKey key, TData data)
    {
        uint targetBucket = HashKeyToBucket(key);

        if(FindEntry(key, targetBucket) != nullptr)
        {
            return false;
        }

        AddInternal(key, data, targetBucket);
        return true;
    }